

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O0

result<sockpp::acceptor> *
sockpp::acceptor::create(result<sockpp::acceptor> *__return_storage_ptr__,int domain)

{
  bool bVar1;
  error_code *err;
  int *piVar2;
  acceptor local_40;
  undefined1 local_30 [8];
  result<int> res;
  int domain_local;
  
  res.err_._M_cat._4_4_ = domain;
  create_handle((result<int> *)local_30,domain);
  bVar1 = sockpp::result::operator_cast_to_bool((result *)local_30);
  if (bVar1) {
    piVar2 = result<int>::value((result<int> *)local_30);
    acceptor(&local_40,*piVar2);
    result<sockpp::acceptor>::result(__return_storage_ptr__,&local_40);
    ~acceptor(&local_40);
  }
  else {
    err = result<int>::error((result<int> *)local_30);
    result<sockpp::acceptor>::result(__return_storage_ptr__,err);
  }
  return __return_storage_ptr__;
}

Assistant:

result<acceptor> acceptor::create(int domain) noexcept {
    if (auto res = create_handle(domain); !res)
        return res.error();
    else
        return acceptor(res.value());
}